

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TasmanianSparseGrid.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
TasGrid::TasmanianSparseGrid::getDifferentiationWeights
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,TasmanianSparseGrid *this
          ,vector<double,_std::allocator<double>_> *x)

{
  vector<double,_std::allocator<double>_> *x_local;
  TasmanianSparseGrid *this_local;
  vector<double,_std::allocator<double>_> *w;
  
  ::std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__);
  getDifferentiationWeights(this,x,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> TasmanianSparseGrid::getDifferentiationWeights(std::vector<double> const &x) const{
    std::vector<double> w;
    getDifferentiationWeights(x, w);
    return w;
}